

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edit_distance.cpp
# Opt level: O0

void __thiscall EditDistance::updateDpPosition(EditDistance *this,int i,int j,int d)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  int64_t iVar6;
  int64_t iVar7;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  EditDistance *in_RDI;
  int diagonalCost;
  int minDiagonalCost;
  int min_deletion_costs_1;
  int min_insertion_costs_1;
  int minChange;
  int min_deletion_costs;
  int min_insertion_costs;
  IntView<0> *jVar;
  IntView<0> *iVar;
  IntView<0> *in_stack_ffffffffffffff40;
  vec<int> *pvVar8;
  IntView<0> *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  EditDistance *this_00;
  
  this_00 = (EditDistance *)(in_RDI->seq2 + (in_EDX + -1));
  if ((in_ESI == 0) && (in_EDX == 0)) {
    return;
  }
  if (in_ESI == 0) {
    iVar2 = getMinimumInsertionCosts
                      ((EditDistance *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
                       ,in_stack_ffffffffffffff80);
    uVar3 = matrixCoord(in_RDI,0,in_EDX + -1);
    piVar5 = vec<int>::operator[](&in_RDI->dpMatrix,uVar3);
    iVar4 = *piVar5;
    uVar3 = matrixCoord(in_RDI,0,in_EDX);
    piVar5 = vec<int>::operator[](&in_RDI->dpMatrix,uVar3);
    *piVar5 = iVar4 + iVar2;
    return;
  }
  if (in_EDX == 0) {
    iVar4 = getMinimumDeletionCosts
                      ((EditDistance *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
                       ,in_stack_ffffffffffffff80);
    uVar3 = matrixCoord(in_RDI,in_ESI + -1,0);
    piVar5 = vec<int>::operator[](&in_RDI->dpMatrix,uVar3);
    iVar4 = *piVar5 + iVar4;
    pvVar8 = &in_RDI->dpMatrix;
    uVar3 = matrixCoord(in_RDI,in_ESI,0);
    piVar5 = vec<int>::operator[](pvVar8,uVar3);
    *piVar5 = iVar4;
    return;
  }
  iVar4 = in_RDI->seqSize * 2 * in_RDI->max_id_cost;
  if (in_ESI - in_ECX <= in_EDX + -1) {
    in_stack_ffffffffffffffc8 =
         getMinimumInsertionCosts
                   ((EditDistance *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                    in_stack_ffffffffffffff80);
    uVar3 = matrixCoord(in_RDI,in_ESI,in_EDX + -1);
    piVar5 = vec<int>::operator[](&in_RDI->dpMatrix,uVar3);
    local_3c = *piVar5 + in_stack_ffffffffffffffc8;
    piVar5 = std::min<int>((int *)&stack0xffffffffffffffcc,&local_3c);
    iVar4 = *piVar5;
  }
  if (in_EDX < in_ESI + in_ECX) {
    local_40 = getMinimumDeletionCosts
                         ((EditDistance *)
                          CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                          in_stack_ffffffffffffff80);
    uVar3 = matrixCoord(in_RDI,in_ESI + -1,in_EDX);
    piVar5 = vec<int>::operator[](&in_RDI->dpMatrix,uVar3);
    local_44 = *piVar5 + local_40;
    piVar5 = std::min<int>((int *)&stack0xffffffffffffffcc,&local_44);
    iVar4 = *piVar5;
  }
  bVar1 = IntView<0>::isFixed((IntView<0> *)0x1da4db);
  if ((bVar1) && (bVar1 = IntView<0>::isFixed((IntView<0> *)0x1da4f1), bVar1)) {
    iVar6 = IntView<0>::getVal(in_stack_ffffffffffffff40);
    iVar7 = IntView<0>::getVal(in_stack_ffffffffffffff40);
    if (iVar6 == iVar7) {
      uVar3 = matrixCoord(in_RDI,in_ESI + -1,in_EDX + -1);
      piVar5 = vec<int>::operator[](&in_RDI->dpMatrix,uVar3);
      piVar5 = std::min<int>((int *)&stack0xffffffffffffffcc,piVar5);
      iVar4 = *piVar5;
      goto LAB_001da5fd;
    }
  }
  local_48 = getMinimumSubstitutionCost
                       (this_00,(IntView<0> *)
                                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        (IntView<0> *)CONCAT44(iVar4,in_stack_ffffffffffffffc8));
  uVar3 = matrixCoord(in_RDI,in_ESI + -1,in_EDX + -1);
  piVar5 = vec<int>::operator[](&in_RDI->dpMatrix,uVar3);
  local_4c = *piVar5 + local_48;
  piVar5 = std::min<int>((int *)&stack0xffffffffffffffcc,&local_4c);
  iVar4 = *piVar5;
LAB_001da5fd:
  pvVar8 = &in_RDI->dpMatrix;
  uVar3 = matrixCoord(in_RDI,in_ESI,in_EDX);
  piVar5 = vec<int>::operator[](pvVar8,uVar3);
  *piVar5 = iVar4;
  return;
}

Assistant:

void updateDpPosition(int i, int j, int d) {
		IntView<>* const iVar = &seq1[i - 1];
		IntView<>* const jVar = &seq2[j - 1];

		if (i == 0 && j == 0) {
			// top left position is always 0
		} else if (i == 0) {
			const int min_insertion_costs = getMinimumInsertionCosts(jVar);
			dpMatrix[matrixCoord(i, j)] = dpMatrix[matrixCoord(0, j - 1)] + min_insertion_costs;
		} else if (j == 0) {
			const int min_deletion_costs = getMinimumDeletionCosts(iVar);
			dpMatrix[matrixCoord(i, j)] = dpMatrix[matrixCoord(i - 1, 0)] + min_deletion_costs;
		} else {
			int minChange = seqSize * 2 * max_id_cost;

			if (j - 1 >= i - d) {
				const int min_insertion_costs = getMinimumInsertionCosts(jVar);
				minChange = std::min(minChange, dpMatrix[matrixCoord(i, j - 1)] + min_insertion_costs);
			}
			if (j < i + d) {
				const int min_deletion_costs = getMinimumDeletionCosts(iVar);
				minChange = std::min(minChange, dpMatrix[matrixCoord(i - 1, j)] + min_deletion_costs);
			}

			if (iVar->isFixed() && jVar->isFixed() && iVar->getVal() == jVar->getVal()) {
				// both values fixed and equal
				minChange = std::min(minChange, dpMatrix[matrixCoord(i - 1, j - 1)]);
			} else {
				const int minDiagonalCost = getMinimumSubstitutionCost(iVar, jVar);
				const int diagonalCost = dpMatrix[matrixCoord(i - 1, j - 1)] + minDiagonalCost;
				minChange = std::min(minChange, diagonalCost);
			}
			dpMatrix[matrixCoord(i, j)] = minChange;
		}
	}